

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::getWordVector(FastText *this,Vector *vec,string *word)

{
  bool bVar1;
  const_iterator this_00;
  real *prVar2;
  size_type sVar3;
  Dictionary *in_RDX;
  Vector *in_RDI;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  int32_t ngram;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *ngrams;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff80
  ;
  FastText *this_01;
  real in_stack_ffffffffffffff9c;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  FastText *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffe0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x182d7f);
  this_01 = (FastText *)&stack0xffffffffffffffc8;
  Dictionary::getSubwords(in_RDX,(string *)in_stack_ffffffffffffffe0._M_pi);
  local_50 = this_01;
  Vector::zero((Vector *)this_01);
  this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50;
  local_58._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
  this_00 = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff80,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff78);
    auVar4 = in_ZMM0._0_16_;
    if (!bVar1) break;
    prVar2 = (real *)__gnu_cxx::
                     __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_58);
    in_stack_ffffffffffffff9c = *prVar2;
    addInputVector(this_01,in_RDI,(int32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_58);
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)this_02._M_pi);
  if (sVar3 != 0) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)this_02._M_pi);
    vcvtusi2sd_avx512f(auVar4,sVar3);
    Vector::mul((Vector *)this_00._M_current,in_stack_ffffffffffffff9c);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  return;
}

Assistant:

void FastText::getWordVector(Vector& vec, const std::string& word) const {
  const std::vector<int32_t>& ngrams = dict_->getSubwords(word);
  vec.zero();
  for (int32_t ngram : ngrams) {
    addInputVector(vec, ngram);
  }

  if (ngrams.size() > 0) {
    vec.mul(1.0 / ngrams.size());
  }
}